

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall QHexView::cut(QHexView *this,bool hex)

{
  QHexDocument *this_00;
  bool bVar1;
  char *__filename;
  EVP_PKEY_CTX *in_RDX;
  undefined7 in_register_00000031;
  
  copy(this,(EVP_PKEY_CTX *)CONCAT71(in_register_00000031,hex),in_RDX);
  if (this->m_readonly != false) {
    return;
  }
  bVar1 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar1) {
    removeSelection(this);
    return;
  }
  this_00 = this->m_hexdocument;
  __filename = (char *)QHexCursor::offset(this->m_hexcursor);
  QHexDocument::remove(this_00,__filename);
  return;
}

Assistant:

void QHexView::cut(bool hex) {
    this->copy(hex);
    if(m_readonly)
        return;

    if(m_hexcursor->hasSelection())
        this->removeSelection();
    else
        m_hexdocument->remove(m_hexcursor->offset(), 1);
}